

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O0

Port * __thiscall rtosc::MidiMapperRT::addWatchPort(MidiMapperRT *this)

{
  function<void_(const_char_*,_rtosc::RtData_&)> *in_RSI;
  Port *in_RDI;
  
  in_RDI->name = "midi-add-watch";
  in_RDI->metadata = "";
  in_RDI->ports = (Ports *)0x0;
  std::function<void(char_const*,rtosc::RtData&)>::
  function<rtosc::MidiMapperRT::addWatchPort()::__0,void>(in_RSI,(anon_class_8_1_8991fb9c *)in_RSI);
  return in_RDI;
}

Assistant:

Port MidiMapperRT::addWatchPort(void) {
    return Port{"midi-add-watch","",0, [this](msg_t, RtData&) {
        this->addWatch();
    }};
}